

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Block * __thiscall MixedArena::alloc<wasm::Block>(MixedArena *this)

{
  Block *pBVar1;
  
  pBVar1 = (Block *)allocSpace(this,0x40,8);
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (pBVar1->name).super_IString.str._M_len = 0;
  (pBVar1->name).super_IString.str._M_str = (char *)0x0;
  (pBVar1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (pBVar1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pBVar1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pBVar1->list).allocator = this;
  return pBVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }